

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoods
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int k;
  int iVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 in_XMM2_Qb;
  
  pfVar4 = this->gPartials[bufferIndex];
  pfVar5 = this->gCategoryWeights[categoryWeightsIndex];
  pfVar6 = this->gStateFrequencies[stateFrequenciesIndex];
  uVar2 = this->kPatternCount;
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    iVar10 = 0;
  }
  else {
    iVar3 = this->kStateCount;
    pfVar7 = this->integrationTmp;
    uVar13 = 0;
    iVar10 = 0;
    iVar14 = 0;
    do {
      if (0 < iVar3) {
        iVar15 = 0;
        lVar16 = 0;
        do {
          iVar15 = iVar15 + -1;
          *(float *)((long)pfVar7 + lVar16 + (long)iVar14 * 4) =
               *(float *)((long)pfVar4 + lVar16 + (long)iVar10 * 4) * *pfVar5;
          lVar16 = lVar16 + 4;
        } while (-iVar3 != iVar15);
        iVar14 = iVar14 - iVar15;
        iVar10 = iVar10 - iVar15;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar2);
  }
  iVar3 = this->kCategoryCount;
  if (1 < (long)iVar3) {
    lVar16 = 1;
    iVar14 = this->kStateCount;
    do {
      if (0 < (int)uVar2) {
        uVar13 = 0;
        iVar15 = 0;
        pfVar7 = this->integrationTmp;
        do {
          if (0 < iVar14) {
            iVar11 = 0;
            lVar17 = 0;
            do {
              iVar11 = iVar11 + -1;
              auVar19 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[lVar16]),
                                        ZEXT416(*(uint *)((long)pfVar4 + lVar17 + (long)iVar10 * 4))
                                        ,ZEXT416(*(uint *)((long)pfVar7 + lVar17 + (long)iVar15 * 4)
                                                ));
              *(int *)((long)pfVar7 + lVar17 + (long)iVar15 * 4) = auVar19._0_4_;
              lVar17 = lVar17 + 4;
            } while (-iVar14 != iVar11);
            iVar15 = iVar15 - iVar11;
            iVar10 = iVar10 - iVar11;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar2);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar3);
  }
  if (0 < (int)uVar2) {
    lVar16 = 0;
    iVar10 = 0;
    do {
      iVar3 = this->kStateCount;
      if ((long)iVar3 < 1) {
        dVar18 = 0.0;
      }
      else {
        auVar19 = ZEXT816(0);
        lVar17 = 0;
        do {
          auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)pfVar6[lVar17]),
                                    ZEXT416((uint)this->integrationTmp[iVar10 + lVar17]));
          lVar17 = lVar17 + 1;
        } while (iVar3 != lVar17);
        dVar18 = (double)auVar19._0_4_;
        iVar10 = iVar10 + iVar3;
      }
      dVar18 = log(dVar18);
      this->outLogLikelihoodsTmp[lVar16] = (float)dVar18;
      lVar16 = lVar16 + 1;
      uVar9 = (ulong)this->kPatternCount;
    } while (lVar16 < (long)uVar9);
  }
  if (-1 < scalingFactorsIndex) {
    if ((int)uVar9 < 1) {
      *outSumLogLikelihood = 0.0;
      return 0;
    }
    uVar12 = 0;
    pfVar4 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    pfVar5 = this->outLogLikelihoodsTmp;
    do {
      pfVar5[uVar12] = pfVar4[uVar12] + pfVar5[uVar12];
      uVar12 = uVar12 + 1;
    } while ((uVar9 & 0xffffffff) != uVar12);
  }
  *outSumLogLikelihood = 0.0;
  if ((int)uVar9 < 1) {
    return 0;
  }
  pdVar8 = this->gPatternWeights;
  pfVar4 = this->outLogLikelihoodsTmp;
  auVar19 = ZEXT816(0) << 0x40;
  uVar12 = 0;
  do {
    auVar20._0_8_ = (double)pfVar4[uVar12];
    auVar20._8_8_ = in_XMM2_Qb;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pdVar8[uVar12];
    auVar19 = vfmadd231sd_fma(auVar19,auVar20,auVar1);
    uVar12 = uVar12 + 1;
    dVar18 = auVar19._0_8_;
    *outSumLogLikelihood = dVar18;
  } while ((uVar9 & 0xffffffff) != uVar12);
  return (uint)(!NAN(dVar18) && !NAN(dVar18)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                            const int categoryWeightsIndex,
                            const int stateFrequenciesIndex,
                            const int scalingFactorsIndex,
                            double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];
    int u = 0;
    int v = 0;
    for (int k = 0; k < kPatternCount; k++) {
        for (int i = 0; i < kStateCount; i++) {
            integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
            u++;
            v++;
        }
        v += P_PAD;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                u++;
                v++;
            }
            v += P_PAD;
        }
    }
    u = 0;
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE sum = 0.0;
        for (int i = 0; i < kStateCount; i++) {
            sum += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sum);
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        for(int i=0; i<kPatternCount; i++) {
            outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
        }
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    // TODO: merge the three kPatternCount loops above into one

    return returnCode;
}